

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::AsymVerifyInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Session *this_00;
  Token *pTVar9;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar10;
  CryptoFactory *pCVar11;
  SoftHSM *inAsymmetricCryptoOp;
  DSAPublicKey *publicKey;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar12;
  undefined4 uVar13;
  SoftHSM *pSVar14;
  undefined8 uVar15;
  undefined8 *inParam;
  bool local_58;
  undefined8 local_50;
  long local_48;
  Token *local_40;
  size_t local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar7 = Session::getOpType(this_00);
  if (iVar7 != 0) {
    return 0x90;
  }
  pTVar9 = Session::getToken(this_00);
  if (pTVar9 == (Token *)0x0) {
    return 5;
  }
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar7 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar7 == '\0') {
    return 0x82;
  }
  local_40 = pTVar9;
  iVar7 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar8 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar10 = haveRead(sessionState,(CK_BBOOL)iVar7,(CK_BBOOL)iVar8);
  if (CVar10 != 0) {
    if (CVar10 != 0x101) {
      return CVar10;
    }
    softHSMLog(6,"AsymVerifyInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x13e3,"User is not authorized");
    return 0x101;
  }
  iVar7 = (*key->_vptr_OSObject[4])(key,0x10a,0);
  if ((char)iVar7 == '\0') {
    return 0x68;
  }
  bVar6 = isMechanismPermitted(this,key,pMechanism);
  if (!bVar6) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x40) {
    switch(CVar1) {
    case 1:
      uVar15 = 3;
      goto LAB_0013687e;
    default:
      goto switchD_00136743_caseD_2;
    case 3:
      uVar15 = 1;
LAB_0013687e:
      inParam = (undefined8 *)0x0;
      local_38 = 0;
LAB_00136884:
      local_58 = false;
      goto LAB_00136aed;
    case 5:
      uVar15 = 2;
      goto LAB_00136ae5;
    case 6:
      uVar15 = 5;
      goto LAB_00136ae5;
    case 0xd:
      plVar2 = (long *)pMechanism->pParameter;
      if ((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
        iVar7 = 0x142e;
        goto LAB_00136df4;
      }
      lVar12 = *plVar2;
      if (lVar12 < 0x255) {
        if (lVar12 == 0x220) {
          local_50._0_4_ = 2;
          lVar12 = 1;
          uVar13 = 1;
        }
        else {
          if (lVar12 != 0x250) {
            return 7;
          }
          local_50._0_4_ = 4;
          lVar12 = 2;
          uVar13 = 3;
        }
      }
      else if (lVar12 == 0x255) {
        local_50._0_4_ = 3;
        lVar12 = 5;
        uVar13 = 2;
      }
      else if (lVar12 == 0x260) {
        local_50._0_4_ = 5;
        lVar12 = 3;
        uVar13 = 4;
      }
      else {
        if (lVar12 != 0x270) {
          return 7;
        }
        local_50._0_4_ = 6;
        lVar12 = 4;
        uVar13 = 5;
      }
      local_50 = CONCAT44(uVar13,(undefined4)local_50);
      if (plVar2[1] != lVar12) {
        return 7;
      }
      local_48 = plVar2[2];
      inParam = &local_50;
      local_38 = 0x10;
      uVar15 = 10;
      goto LAB_00136884;
    case 0xe:
      plVar2 = (long *)pMechanism->pParameter;
      if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x220))
         || (plVar2[1] != 1)) {
        iVar7 = 0x1463;
        goto LAB_00136df4;
      }
      local_50 = 0x100000002;
      local_48 = plVar2[2];
      uVar15 = 0xb;
      goto LAB_00136ad3;
    case 0x11:
      bVar3 = true;
      uVar15 = 0x11;
      inParam = (undefined8 *)0x0;
      local_38 = 0;
      local_58 = false;
      bVar6 = false;
      goto LAB_00136aef;
    case 0x12:
      uVar15 = 0x12;
      break;
    case 0x13:
      uVar15 = 0x13;
      break;
    case 0x14:
      uVar15 = 0x14;
      break;
    case 0x15:
      uVar15 = 0x15;
      break;
    case 0x16:
      uVar15 = 0x16;
    }
    local_58 = true;
    inParam = (undefined8 *)0x0;
    local_38 = 0;
    bVar6 = false;
    bVar3 = true;
    goto LAB_00136aef;
  }
  switch(CVar1) {
  case 0x40:
    uVar15 = 7;
    break;
  case 0x41:
    uVar15 = 8;
    break;
  case 0x42:
    uVar15 = 9;
    break;
  case 0x43:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x250 || (plVar2[1] != 2)))) {
      iVar7 = 0x1487;
LAB_00136df4:
      softHSMLog(3,"AsymVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar7,"Invalid parameters");
      return 7;
    }
    local_50 = 0x300000004;
    local_48 = plVar2[2];
    uVar15 = 0xd;
    goto LAB_00136ad3;
  case 0x44:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x260 || (plVar2[1] != 3)))) {
      iVar7 = 0x1499;
      goto LAB_00136df4;
    }
    local_50 = 0x400000005;
    local_48 = plVar2[2];
    uVar15 = 0xe;
    goto LAB_00136ad3;
  case 0x45:
    plVar2 = (long *)pMechanism->pParameter;
    if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x270)) ||
       (plVar2[1] != 4)) {
      iVar7 = 0x14ab;
      goto LAB_00136df4;
    }
    local_50 = 0x500000006;
    local_48 = plVar2[2];
    uVar15 = 0xf;
    goto LAB_00136ad3;
  case 0x46:
    uVar15 = 6;
    break;
  case 0x47:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x255 || (plVar2[1] != 5)))) {
      iVar7 = 0x1475;
      goto LAB_00136df4;
    }
    local_50 = 0x200000003;
    local_48 = plVar2[2];
    uVar15 = 0xc;
LAB_00136ad3:
    local_58 = true;
    inParam = &local_50;
    local_38 = 0x10;
    bVar3 = false;
    bVar6 = true;
    goto LAB_00136aef;
  default:
    if (CVar1 == 0x1041) {
      bVar4 = true;
      uVar15 = 0x17;
      inParam = (undefined8 *)0x0;
      local_38 = 0;
      local_58 = false;
      bVar6 = false;
      bVar3 = false;
      goto LAB_00136af1;
    }
    if (CVar1 != 0x1057) {
      return 0x70;
    }
    bVar5 = true;
    uVar15 = 0x1a;
    inParam = (undefined8 *)0x0;
    local_38 = 0;
    local_58 = false;
    bVar6 = false;
    bVar3 = false;
    bVar4 = false;
    goto LAB_00136af3;
  }
LAB_00136ae5:
  local_58 = true;
  inParam = (undefined8 *)0x0;
  local_38 = 0;
LAB_00136aed:
  bVar6 = true;
  bVar3 = false;
LAB_00136aef:
  bVar4 = false;
LAB_00136af1:
  bVar5 = false;
LAB_00136af3:
  if (bVar6) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,1);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar14 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_00,iVar7);
    if (publicKey == (DSAPublicKey *)0x0) goto LAB_00136c67;
    CVar10 = getRSAPublicKey(pSVar14,(RSAPublicKey *)publicKey,local_40,key);
  }
  else if (bVar3) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,2);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar14 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_02,iVar7);
    if (publicKey == (DSAPublicKey *)0x0) goto LAB_00136c67;
    CVar10 = getDSAPublicKey(pSVar14,publicKey,local_40,key);
  }
  else if (bVar4) {
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,5);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar14 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_04,iVar7);
    if (publicKey == (DSAPublicKey *)0x0) {
LAB_00136c67:
      pCVar11 = CryptoFactory::i();
      (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
      return 2;
    }
    CVar10 = getECPublicKey(pSVar14,(ECPublicKey *)publicKey,local_40,key);
  }
  else {
    if (!bVar5) {
      return 0x70;
    }
    pCVar11 = CryptoFactory::i();
    iVar7 = (*pCVar11->_vptr_CryptoFactory[2])(pCVar11,7);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar7);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar14 = inAsymmetricCryptoOp;
    iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_06,iVar7);
    if (publicKey == (DSAPublicKey *)0x0) goto LAB_00136c67;
    CVar10 = getEDPublicKey(pSVar14,(EDPublicKey *)publicKey,local_40,key);
  }
  if (CVar10 != 0) {
    (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
    pCVar11 = CryptoFactory::i();
    (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
    return 5;
  }
  if ((local_58 == false) ||
     (iVar7 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[7])
                        (inAsymmetricCryptoOp,publicKey,uVar15,inParam,local_38),
     (char)iVar7 != '\0')) {
    Session::setOpType(this_00,6);
    Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
    Session::setMechanism(this_00,(Type)uVar15);
    Session::setParameters(this_00,inParam,local_38);
    Session::setAllowMultiPartOp(this_00,local_58);
    Session::setAllowSinglePartOp(this_00,true);
    Session::setPublicKey(this_00,&publicKey->super_PublicKey);
    return 0;
  }
  (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
  pCVar11 = CryptoFactory::i();
  (*pCVar11->_vptr_CryptoFactory[3])(pCVar11,inAsymmetricCryptoOp);
switchD_00136743_caseD_2:
  return 0x70;
}

Assistant:

CK_RV SoftHSM::AsymVerifyInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for verifying
	if (!key->getBooleanValue(CKA_VERIFY, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;

			unsigned long expectedMgf;
			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					expectedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					expectedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					expectedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					expectedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					expectedMgf = CKG_MGF1_SHA512;
					break;
				default:
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != expectedMgf) {
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PublicKey* publicKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPublicKey((RSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPublicKey((DSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPublicKey((ECPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPublicKey((EDPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPublicKey((GOSTPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }